

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_info_about_current_iteration(uint time_step,Grid *grid)

{
  Grid *grid_local;
  uint time_step_local;
  
  printf("\rTime step is %u of %u.",(ulong)time_step,(ulong)(grid->T_nodes - 1));
  fflush(_stdout);
  return;
}

Assistant:

void print_info_about_current_iteration (unsigned time_step, Grid const * grid) {
#ifdef ALTERNATIVE_OUTPUT
  printf ("\r[....] Time step is %u of %u.", time_step + 1, grid->T_nodes);
#else
  printf ("\rTime step is %u of %u.", time_step, grid->T_nodes - 1);
#endif /* ALTERNATIVE_OUTPUT */
  fflush (stdout);
  return;
}